

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O2

void __thiscall aeron::Image::Image(Image *this)

{
  this->_vptr_Image = (_func_int **)&PTR__Image_0018a9d8;
  std::array<aeron::concurrent::AtomicBuffer,_3UL>::array(&this->m_termBuffers);
  (this->m_header).m_context = this;
  (this->m_header).m_buffer._vptr_AtomicBuffer = (_func_int **)&PTR__AtomicBuffer_0018a698;
  (this->m_header).m_buffer.m_buffer = (uint8_t *)0x0;
  (this->m_header).m_buffer.m_length = 0;
  (this->m_header).m_offset = 0;
  (this->m_header).m_initialTermId = 0;
  concurrent::status::UnsafeBufferPosition::UnsafeBufferPosition
            ((UnsafeBufferPosition *)&this->m_subscriberPosition,
             (UnsafeBufferPosition *)NULL_POSITION);
  (this->m_logBuffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_logBuffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_sourceIdentity)._M_dataplus._M_p = (pointer)&(this->m_sourceIdentity).field_2;
  (this->m_sourceIdentity)._M_string_length = 0;
  (this->m_sourceIdentity).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(this->m_exceptionHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_exceptionHandler).super__Function_base._M_functor + 8) = 0;
  (this->m_exceptionHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_exceptionHandler)._M_invoker = (_Invoker_type)0x0;
  return;
}

Assistant:

Image() :
        m_header(0, 0, this),
        m_subscriberPosition(NULL_POSITION)
    {
    }